

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# way.cc
# Opt level: O0

void re2c::fprint_way_arc(FILE *f,way_arc_t *arc)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint32_t u;
  uint32_t l;
  size_t i;
  size_t ranges;
  way_arc_t *arc_local;
  FILE *f_local;
  
  sVar3 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::size(arc);
  if (sVar3 == 1) {
    pvVar4 = std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::operator[](arc,0);
    uVar1 = pvVar4->first;
    pvVar4 = std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::operator[](arc,0);
    if (uVar1 == pvVar4->second) {
      pvVar4 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator[](arc,0);
      fprintf((FILE *)f,"\\x%X",(ulong)pvVar4->first);
      return;
    }
  }
  fprintf((FILE *)f,"[");
  for (_u = 0; _u < sVar3; _u = _u + 1) {
    pvVar4 = std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::operator[](arc,_u);
    uVar1 = pvVar4->first;
    pvVar4 = std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::operator[](arc,_u);
    uVar2 = pvVar4->second;
    fprintf((FILE *)f,"\\x%X",(ulong)uVar1);
    if (uVar1 != uVar2) {
      fprintf((FILE *)f,"-\\x%X",(ulong)uVar2);
    }
  }
  fprintf((FILE *)f,"]");
  return;
}

Assistant:

void fprint_way_arc (FILE * f, const way_arc_t & arc)
{
	const size_t ranges = arc.size ();
	if (ranges == 1 && arc[0].first == arc[0].second)
	{
		fprintf (f, "\\x%X", arc[0].first);
	}
	else
	{
		fprintf (f, "[");
		for (size_t i = 0; i < ranges; ++i)
		{
			const uint32_t l = arc[i].first;
			const uint32_t u = arc[i].second;
			fprintf (f, "\\x%X", l);
			if (l != u)
			{
				fprintf (f, "-\\x%X", u);
			}
		}
		fprintf (f, "]");
	}
}